

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O0

void TPZBuildMultiphysicsMesh::TransferFromMultiPhysics
               (TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  TPZBaseMatrix *pTVar1;
  TPZCompMesh *in_RSI;
  TPZFMatrix<std::complex<double>_> *cplxSol;
  TPZFMatrix<double> *realSol;
  TPZBaseMatrix *solMF;
  TPZCompMesh *in_stack_000000e8;
  TPZVec<TPZCompMesh_*> *in_stack_000000f0;
  TPZSolutionMatrix *in_stack_ffffffffffffffc0;
  long local_38;
  
  TPZCompMesh::Solution(in_RSI);
  pTVar1 = TPZSolutionMatrix::operator_cast_to_TPZBaseMatrix_(in_stack_ffffffffffffffc0);
  if (pTVar1 == (TPZBaseMatrix *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(pTVar1,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0);
    __dynamic_cast(pTVar1,&TPZBaseMatrix::typeinfo,&TPZFMatrix<std::complex<double>>::typeinfo,0);
  }
  if (local_38 == 0) {
    TransferFromMultiPhysicsT<std::complex<double>>(in_stack_000000f0,in_stack_000000e8);
  }
  else {
    TransferFromMultiPhysicsT<double>(in_stack_000000f0,in_stack_000000e8);
  }
  return;
}

Assistant:

void TPZBuildMultiphysicsMesh::TransferFromMultiPhysics(TPZVec<TPZCompMesh *> &cmeshVec, TPZCompMesh *MFMesh)
{
    TPZBaseMatrix &solMF = MFMesh->Solution();
    
    auto *realSol = dynamic_cast<TPZFMatrix<STATE>*>(&solMF);
    auto *cplxSol = dynamic_cast<TPZFMatrix<CSTATE>*>(&solMF);
    if(realSol) TransferFromMultiPhysicsT<STATE>(cmeshVec,MFMesh);
    else TransferFromMultiPhysicsT<CSTATE>(cmeshVec,MFMesh);
}